

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect_socket.cpp
# Opt level: O2

void __thiscall cppnet::ConnectSocket::OnAccept(ConnectSocket *this)

{
  element_type *peVar1;
  element_type *this_00;
  shared_ptr<cppnet::AlloterWrap> *alloter_00;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_01;
  __shared_ptr<cppnet::Socket,(__gnu_cxx::_Lock_policy)2> *this_02;
  SingletonLogger *this_03;
  char *pcVar2;
  uint err;
  SysCallInt64Result SVar3;
  shared_ptr<cppnet::RWSocket> sock;
  shared_ptr<cppnet::CppNetBase> cppnet_base;
  shared_ptr<cppnet::AlloterWrap> alloter;
  shared_ptr<cppnet::AlloterWrap> *local_b8;
  __shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2> local_b0;
  __shared_ptr<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2> local_a0;
  __shared_ptr<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2> local_90;
  __weak_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2> local_80;
  __shared_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2> local_70;
  Address address;
  
  do {
    MakePoolAlloterPtr();
    std::make_shared<cppnet::AlloterWrap,std::shared_ptr<cppnet::Alloter>>
              ((shared_ptr<cppnet::Alloter> *)&alloter);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&address._ip);
    Address::Address(&address);
    SVar3 = OsHandle::Accept((this->super_Socket)._sock,&address);
    alloter_00 = (shared_ptr<cppnet::AlloterWrap> *)SVar3._return_value;
    if ((long)alloter_00 < 0) {
      err = SVar3._errno;
      if ((err != 0xb) && (err != 0x2733)) {
        this_03 = Singleton<cppnet::SingletonLogger>::Instance();
        pcVar2 = ErrnoInfo(err);
        SingletonLogger::Error
                  (this_03,
                   "/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/socket/connect_socket.cpp"
                   ,0x6a,"accept socket filed! errno:%d, info:%s",(ulong)err,pcVar2);
      }
LAB_0010b400:
      Address::~Address(&address);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&alloter.super___shared_ptr<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      return;
    }
    std::__shared_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&cppnet_base.super___shared_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>,
               &(this->super_Socket)._cppnet_base);
    if (cppnet_base.super___shared_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&cppnet_base.super___shared_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      goto LAB_0010b400;
    }
    SocketNoblocking((uint64_t)alloter_00);
    std::__shared_ptr<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_a0,
               &alloter.super___shared_ptr<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2>);
    MakeRWSocket((uint64_t)&sock,alloter_00);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0._M_refcount);
    (*((sock.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_Socket)
      ._vptr_Socket[3])(sock.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                        ,(ulong)(this->super_Socket)._addr._port);
    peVar1 = sock.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_70,
               &cppnet_base.super___shared_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>);
    std::__weak_ptr<cppnet::CppNetBase,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__weak_ptr<cppnet::CppNetBase,(__gnu_cxx::_Lock_policy)2> *)
               &(peVar1->super_Socket)._cppnet_base,&local_70);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
    peVar1 = sock.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__weak_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
              (&local_80,
               &(this->super_Socket)._event_actions.
                super___weak_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>);
    std::__weak_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(peVar1->super_Socket)._event_actions.
                super___weak_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>,&local_80);
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_80._M_refcount);
    Address::operator=(&((sock.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_Socket)._addr,&address);
    peVar1 = sock.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_ptr<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_90,&(this->super_Socket)._dispatcher);
    std::__weak_ptr<cppnet::Dispatcher,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__weak_ptr<cppnet::Dispatcher,(__gnu_cxx::_Lock_policy)2> *)
               &(peVar1->super_Socket)._dispatcher,&local_90);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
    this_01 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               *)Socket::__all_socket_map();
    local_b8 = alloter_00;
    this_02 = (__shared_ptr<cppnet::Socket,(__gnu_cxx::_Lock_policy)2> *)
              std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[](this_01,(key_type *)&local_b8);
    std::__shared_ptr<cppnet::Socket,(__gnu_cxx::_Lock_policy)2>::operator=
              (this_02,&sock.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>);
    this_00 = cppnet_base.super___shared_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_b0,&sock.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>);
    CppNetBase::OnAccept(this_00,(shared_ptr<cppnet::RWSocket> *)&local_b0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0._M_refcount);
    (*((sock.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_Socket)
      ._vptr_Socket[7])();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&sock.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&cppnet_base.super___shared_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    Address::~Address(&address);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&alloter.super___shared_ptr<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  } while( true );
}

Assistant:

void ConnectSocket::OnAccept() {
    while (true) {
        std::shared_ptr<AlloterWrap> alloter = std::make_shared<AlloterWrap>(MakePoolAlloterPtr());
        Address address;
        //may get more than one connections
        auto ret = OsHandle::Accept(_sock, address);
        if (ret._return_value < 0) {
            if (ret._errno == EAGAIN || ret._errno == WSAEWOULDBLOCK) {
                break;
            }
            LOG_ERROR("accept socket filed! errno:%d, info:%s", ret._errno, ErrnoInfo(ret._errno));
            break;
        }

        auto cppnet_base = _cppnet_base.lock();
        if (!cppnet_base) {
            return;
        }

        //set the socket noblocking
        SocketNoblocking(ret._return_value);
        
        //create a new socket.
        auto sock = MakeRWSocket(ret._return_value, alloter);

        sock->SetListenPort(_addr.GetAddrPort());
        sock->SetCppNetBase(cppnet_base);
        sock->SetEventActions(_event_actions);
        sock->SetAddress(std::move(address));
        sock->SetDispatcher(GetDispatcher());

        __all_socket_map[ret._return_value] = sock;
    
        //call accept call back function
        cppnet_base->OnAccept(sock);

        //start read
        sock->Read();
    }
}